

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O3

int uv_tcp_init_ex(uv_loop_t *loop,uv_tcp_t *tcp,uint flags)

{
  void *pvVar1;
  int iVar2;
  uint domain;
  int iVar3;
  
  domain = flags & 0xff;
  iVar3 = -0x16;
  if ((flags < 0x100) && ((flags & 0xf7) == 2 || domain == 0)) {
    uv__stream_init(loop,(uv_stream_t *)tcp,UV_TCP);
    iVar3 = 0;
    if (domain != 0) {
      iVar2 = maybe_new_socket(tcp,domain,0);
      iVar3 = 0;
      if (iVar2 != 0) {
        pvVar1 = tcp->handle_queue[0];
        *(void **)tcp->handle_queue[1] = pvVar1;
        *(void **)((long)pvVar1 + 8) = tcp->handle_queue[1];
        iVar3 = iVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

int uv_tcp_init_ex(uv_loop_t* loop, uv_tcp_t* tcp, unsigned int flags) {
  int domain;

  /* Use the lower 8 bits for the domain */
  domain = flags & 0xFF;
  if (domain != AF_INET && domain != AF_INET6 && domain != AF_UNSPEC)
    return UV_EINVAL;

  if (flags & ~0xFF)
    return UV_EINVAL;

  uv__stream_init(loop, (uv_stream_t*)tcp, UV_TCP);

  /* If anything fails beyond this point we need to remove the handle from
   * the handle queue, since it was added by uv__handle_init in uv_stream_init.
   */

  if (domain != AF_UNSPEC) {
    int err = maybe_new_socket(tcp, domain, 0);
    if (err) {
      QUEUE_REMOVE(&tcp->handle_queue);
      return err;
    }
  }

  return 0;
}